

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O1

bool __thiscall
ON_RenderContentPrivate::ChangeChild
          (ON_RenderContentPrivate *this,ON_RenderContent *old_child,ON_RenderContent *new_child)

{
  ON_RenderContentPrivate *pOVar1;
  ON_RenderContentPrivate *pOVar2;
  bool bVar3;
  ON_RenderContent *pOVar4;
  ON_RenderContent *pOVar5;
  
  if (old_child == (ON_RenderContent *)0x0) {
    return false;
  }
  pOVar4 = this->m_first_child;
  if (this->m_first_child == old_child) {
    pOVar4 = new_child;
    if (new_child == (ON_RenderContent *)0x0) {
      pOVar4 = old_child->_private->m_next_sibling;
    }
    this->m_first_child = pOVar4;
LAB_005a2d4b:
    if (new_child != (ON_RenderContent *)0x0) {
      pOVar1 = old_child->_private;
      pOVar2 = new_child->_private;
      pOVar2->m_next_sibling = pOVar1->m_next_sibling;
      pOVar2->m_parent = pOVar1->m_parent;
    }
    (*(old_child->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4])(old_child);
    bVar3 = true;
  }
  else {
    do {
      pOVar5 = pOVar4;
      if (pOVar5 == (ON_RenderContent *)0x0) {
        pOVar5 = (ON_RenderContent *)0x0;
        break;
      }
      pOVar4 = pOVar5->_private->m_next_sibling;
    } while (pOVar4 != old_child);
    if (pOVar5 != (ON_RenderContent *)0x0) {
      pOVar4 = new_child;
      if (new_child == (ON_RenderContent *)0x0) {
        pOVar4 = old_child->_private->m_next_sibling;
      }
      pOVar5->_private->m_next_sibling = pOVar4;
      if (pOVar5 != (ON_RenderContent *)0x0) goto LAB_005a2d4b;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ON_RenderContentPrivate::ChangeChild(ON_RenderContent* old_child, ON_RenderContent* new_child)
{
  if (nullptr == old_child)
    return false;

  if (old_child == m_first_child)
  {
    if (nullptr != new_child)
    {
      m_first_child = new_child;
    }
    else
    {
      m_first_child = old_child->_private->m_next_sibling;
    }
  }
  else
  {
    const ON_RenderContent* prev_sibling = FindPrevSibling(old_child);
    if (nullptr == prev_sibling)
      return false;

    if (nullptr != new_child)
    {
      prev_sibling->_private->m_next_sibling = new_child;
    }
    else
    {
      prev_sibling->_private->m_next_sibling = old_child->_private->m_next_sibling;
    }
  }

  if (nullptr != new_child)
  {
    new_child->_private->m_next_sibling = old_child->_private->m_next_sibling;
    new_child->_private->m_parent = old_child->_private->m_parent;
  }

  delete old_child;

  return true;
}